

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dill_util.c
# Opt level: O2

int dill_is_label_mark(dill_stream_conflict s)

{
  private_ctx pdVar1;
  int iVar2;
  
  pdVar1 = s->p;
  iVar2 = (pdVar1->branch_table).max_alloc;
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  iVar2 = iVar2 + 1;
  do {
    iVar2 = iVar2 + -1;
    if (iVar2 == 0) {
      return 0;
    }
  } while (*(pdVar1->branch_table).label_locs !=
           *(int *)&pdVar1->cur_ip - *(int *)&pdVar1->code_base);
  return 1;
}

Assistant:

extern int
dill_is_label_mark(dill_stream s)
{
    struct branch_table* t = &s->p->branch_table;
    int i;
    int current_loc = (int)((char*)s->p->cur_ip - (char*)s->p->code_base);
    for (i = 0; i < t->max_alloc; i++) {
        if (t->label_locs[0] == current_loc)
            return 1;
    }
    return 0;
}